

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

uint8_t keyscan_all(tgestate_t *state)

{
  byte bVar1;
  long in_RDI;
  bool bVar2;
  int carry;
  uint8_t keys;
  uint16_t port;
  int in_stack_ffffffffffffffec;
  uint uVar3;
  undefined1 in_stack_fffffffffffffff4;
  ushort uVar4;
  
  uVar3 = 0;
  uVar4 = 0xfefe;
  do {
    bVar1 = (*(code *)**(undefined8 **)(in_RDI + 0x18))(*(undefined8 *)(in_RDI + 0x18),uVar4);
    bVar1 = (bVar1 ^ 0xff) & 0x1f;
    if (bVar1 != 0) goto LAB_0010baaa;
    bVar2 = (int)(uint)uVar4 >> 0xf != 0;
    uVar3 = (uint)bVar2;
    uVar4 = (uVar4 & 0x7f80) << 1 | (ushort)bVar2 << 8 | uVar4 & 0xff;
  } while (uVar3 != 0);
  bVar1 = 0;
LAB_0010baaa:
  gamedelay((tgestate_t *)CONCAT26(uVar4,CONCAT15(bVar1,CONCAT14(in_stack_fffffffffffffff4,uVar3))),
            in_stack_ffffffffffffffec);
  return bVar1;
}

Assistant:

uint8_t keyscan_all(tgestate_t *state)
{
  uint16_t port;  /* was BC */
  uint8_t  keys;  /* was A */
  int      carry = 0;

  assert(state != NULL);

  /* Scan all keyboard ports (0xFEFE .. 0x7FFE). */
  port = port_KEYBOARD_SHIFTZXCV;
  do
  {
    keys = state->speccy->in(state->speccy, port);

    /* Invert bits and mask off key bits. */
    keys = ~keys & 0x1F;
    if (keys)
      goto exit; /* Key(s) pressed */

    /* Rotate the top byte of the port number to get the next port. */
    // Conv: Was RLC B
    carry = (port >> 15) != 0;
    port  = ((port << 1) & 0xFF00) | (carry << 8) | (port & 0x00FF);
  }
  while (carry);

  keys = 0; /* No keys pressed */

exit:

  /* Conv: Timing: The original game keyscans as fast as it can. We can't
   * have that so instead we introduce a short delay and handle game thread
   * termination. */
  gamedelay(state, 3500000 / 50); /* 50/sec */

  return keys;
}